

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

AssertionExpr * __thiscall
slang::ast::SequenceConcatExpr::fromSyntax
          (SequenceConcatExpr *this,DelayedSequenceExprSyntax *syntax,ASTContext *context)

{
  AssertionExprKind AVar1;
  size_t sVar2;
  pointer pEVar3;
  SyntaxNode *pSVar4;
  long lVar5;
  BumpAllocator *this_00;
  uint uVar6;
  bool bVar7;
  int iVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  optional<int> value;
  undefined4 extraout_var_01;
  SequenceConcatExpr *pSVar10;
  ASTContext *extraout_RDX;
  ASTContext *extraout_RDX_00;
  long lVar11;
  bool bVar12;
  SourceRange SVar13;
  SourceRange range;
  SequenceRange SVar14;
  SmallVector<slang::ast::SequenceConcatExpr::Element,_8UL> elems;
  _Storage<unsigned_int,_true> local_1d8;
  _Storage<unsigned_int,_true> _Stack_1d4;
  uint uStack_1d0;
  Element local_1b0;
  SmallVectorBase<slang::ast::SequenceConcatExpr::Element> local_188 [5];
  AssertionExpr *pAVar9;
  
  local_188[0].data_ = (pointer)local_188[0].firstElement;
  local_188[0].len = 0;
  local_188[0].cap = 8;
  sVar2 = (this->elements)._M_extent._M_extent_value;
  if (sVar2 == 0) {
    bVar12 = true;
  }
  else {
    iVar8 = AssertionExpr::bind((int)sVar2,(sockaddr *)syntax,0);
    pAVar9 = (AssertionExpr *)CONCAT44(extraout_var,iVar8);
    AssertionExpr::requireSequence(pAVar9,(ASTContext *)syntax,(DiagCode)0x350008);
    AVar1 = pAVar9->kind;
    local_1b0.delay.min = 0;
    local_1b0.delay.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int>._M_payload = (_Storage<unsigned_int,_true>)0x0;
    local_1b0.delay.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int>._M_engaged = true;
    local_1b0.delayRange = (SourceRange)ZEXT816(0);
    local_1b0.sequence.ptr = pAVar9;
    SmallVectorBase<slang::ast::SequenceConcatExpr::Element>::
    emplace_back<slang::ast::SequenceConcatExpr::Element>(local_188,&local_1b0);
    bVar12 = AVar1 != Invalid;
    context = extraout_RDX;
  }
  pEVar3 = this[2].elements._M_ptr;
  if (pEVar3 != (pointer)0x0) {
    pSVar4 = this[2].super_AssertionExpr.syntax;
    lVar11 = 0;
    do {
      uVar6 = uStack_1d0;
      lVar5 = *(long *)((long)&pSVar4->kind + lVar11);
      local_1d8._M_value = 1;
      uStack_1d0 = uStack_1d0 & 0xffffff00;
      iVar8 = AssertionExpr::bind((int)*(undefined8 *)(lVar5 + 0x68),(sockaddr *)syntax,0);
      pAVar9 = (AssertionExpr *)CONCAT44(extraout_var_00,iVar8);
      AssertionExpr::requireSequence(pAVar9,(ASTContext *)syntax,(DiagCode)0x350008);
      bVar12 = (bool)(bVar12 & pAVar9->kind != Invalid);
      if (*(SyntaxNode **)(lVar5 + 0x28) == (SyntaxNode *)0x0) {
        if (*(SyntaxNode **)(lVar5 + 0x50) == (SyntaxNode *)0x0) {
          if (*(short *)(lVar5 + 0x40) == 0x1e) {
            SVar13 = parsing::Token::range((Token *)(lVar5 + 0x40));
            local_1d8._M_value = 1;
          }
          else if (*(short *)(lVar5 + 0x40) == 0x1b) {
            SVar13 = parsing::Token::range((Token *)(lVar5 + 0x40));
            local_1d8._M_value = 0;
          }
          else {
            SVar13 = (SourceRange)ZEXT816(0);
          }
        }
        else {
          SVar13 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(lVar5 + 0x50));
          SVar14 = SequenceRange::fromSyntax
                             (*(SelectorSyntax **)(lVar5 + 0x50),(ASTContext *)syntax,true);
          local_1d8._M_value = SVar14.min;
          _Stack_1d4._M_value =
               SVar14.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_int>._M_payload;
          uStack_1d0 = CONCAT31(SUB43(uVar6,1),
                                SVar14.max.super__Optional_base<unsigned_int,_true,_true>._M_payload
                                .super__Optional_payload_base<unsigned_int>._M_engaged);
        }
      }
      else {
        SVar13 = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(lVar5 + 0x28));
        value = ASTContext::evalInteger
                          ((ASTContext *)syntax,*(ExpressionSyntax **)(lVar5 + 0x28),
                           (bitmask<slang::ast::ASTFlags>)0x80000);
        range = slang::syntax::SyntaxNode::sourceRange(*(SyntaxNode **)(lVar5 + 0x28));
        bVar7 = ASTContext::requirePositive((ASTContext *)syntax,value,range);
        if (bVar7) {
          local_1d8._M_value =
               value.super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int>._M_payload;
          uStack_1d0 = 1;
          _Stack_1d4._M_value = local_1d8._M_value;
        }
        else {
          bVar12 = false;
        }
      }
      local_1b0.delay.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._4_4_ = uStack_1d0;
      local_1b0.delay.max.super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_payload._M_value = _Stack_1d4._M_value;
      local_1b0.delay.min = local_1d8._M_value;
      local_1b0.delayRange = SVar13;
      local_1b0.sequence.ptr = pAVar9;
      SmallVectorBase<slang::ast::SequenceConcatExpr::Element>::
      emplace_back<slang::ast::SequenceConcatExpr::Element>(local_188,&local_1b0);
      lVar11 = lVar11 + 8;
      context = extraout_RDX_00;
    } while ((long)pEVar3 << 3 != lVar11);
  }
  this_00 = (BumpAllocator *)**(undefined8 **)&(syntax->super_SequenceExprSyntax).super_SyntaxNode;
  iVar8 = SmallVectorBase<slang::ast::SequenceConcatExpr::Element>::copy
                    (local_188,(EVP_PKEY_CTX *)this_00,(EVP_PKEY_CTX *)context);
  local_1b0.delay._0_8_ = CONCAT44(extraout_var_01,iVar8);
  pSVar10 = BumpAllocator::
            emplace<slang::ast::SequenceConcatExpr,std::span<slang::ast::SequenceConcatExpr::Element,18446744073709551615ul>>
                      (this_00,(span<slang::ast::SequenceConcatExpr::Element,_18446744073709551615UL>
                                *)&local_1b0);
  if (!bVar12) {
    local_1b0.delay._0_8_ = pSVar10;
    pSVar10 = (SequenceConcatExpr *)
              BumpAllocator::
              emplace<slang::ast::InvalidAssertionExpr,slang::ast::AssertionExpr_const*&>
                        (this_00,(AssertionExpr **)&local_1b0);
  }
  if (local_188[0].data_ != (pointer)local_188[0].firstElement) {
    operator_delete(local_188[0].data_);
  }
  return &pSVar10->super_AssertionExpr;
}

Assistant:

AssertionExpr& SequenceConcatExpr::fromSyntax(const DelayedSequenceExprSyntax& syntax,
                                              const ASTContext& context) {
    bool ok = true;
    SmallVector<Element, 8> elems;
    if (syntax.first) {
        auto& seq = bind(*syntax.first, context);
        seq.requireSequence(context);
        ok &= !seq.bad();

        SequenceRange delay{0, 0};
        elems.push_back({delay, SourceRange{}, &seq});
    }

    for (auto es : syntax.elements) {
        SequenceRange delay;
        auto& seq = bind(*es->expr, context);
        seq.requireSequence(context);
        ok &= !seq.bad();

        SourceRange delayRange;
        if (es->delayVal) {
            delayRange = es->delayVal->sourceRange();
            auto val = context.evalInteger(*es->delayVal, ASTFlags::AssertionDelayOrRepetition);
            if (!context.requirePositive(val, es->delayVal->sourceRange()))
                ok = false;
            else
                delay.max = delay.min = uint32_t(*val);
        }
        else if (es->range) {
            delayRange = es->range->sourceRange();
            delay = SequenceRange::fromSyntax(*es->range, context,
                                              /* allowUnbounded */ true);
        }
        else if (es->op.kind == TokenKind::Star) {
            delayRange = es->op.range();
            delay.min = 0;
        }
        else if (es->op.kind == TokenKind::Plus) {
            delayRange = es->op.range();
            delay.min = 1;
        }

        elems.push_back(Element{delay, delayRange, &seq});
    }

    auto& comp = context.getCompilation();
    auto result = comp.emplace<SequenceConcatExpr>(elems.copy(comp));
    if (!ok)
        return badExpr(comp, result);

    return *result;
}